

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chromosome.h
# Opt level: O0

void __thiscall Coordinate::turnTo(Coordinate *this,TURNCODE turn)

{
  FACING local_18;
  int newFacing;
  TURNCODE turn_local;
  Coordinate *this_local;
  
  local_18 = this->facing + turn;
  if (local_18 == 4) {
    local_18 = NORTH;
  }
  if (local_18 == ~NORTH) {
    local_18 = WEST;
  }
  this->facing = local_18;
  switch(this->facing) {
  case NORTH:
    this->y = this->y + 1;
    break;
  case EAST:
    this->x = this->x + 1;
    break;
  case SOUTH:
    this->y = this->y + -1;
    break;
  case WEST:
    this->x = this->x + -1;
  }
  return;
}

Assistant:

void turnTo(TURNCODE turn){
        /*        N = 0
         *    W = 3    E = 1
         *        S = 2
         */
        int newFacing = facing + turn;
        if (newFacing == 4){
            newFacing = 0;
        }
        if (newFacing == -1){
            newFacing = 3;
        }
        facing = (FACING) newFacing;

        switch (facing){
            case NORTH:
                y += 1;
                break;
            case EAST:
                x += 1;
                break;
            case SOUTH:
                y -= 1;
                break;
            case WEST:
                x -= 1;
                break;
        }
    }